

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcRoot::IfcRoot(IfcRoot *this,void **vtt)

{
  void **vtt_local;
  IfcRoot *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>,vtt + 1);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>)._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>).
                    _vptr_ObjectHelper +
            (long)(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>).
                  _vptr_ObjectHelper[-3]) = vtt[3];
  std::__cxx11::string::string
            ((string *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>).field_0x10
            );
  STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>::Lazy(&this->OwnerHistory,(LazyObject *)0x0);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->Name);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->Description);
  return;
}

Assistant:

IfcRoot() : Object("IfcRoot") {}